

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMap.c
# Opt level: O2

void Cnf_DeriveMapping(Cnf_Man_t *p)

{
  int *pAreaFlows;
  undefined8 *__ptr;
  void *pvVar1;
  int i;
  Vec_Ptr_t *p_00;
  Dar_Cut_t *pCut;
  uint uVar2;
  ulong uVar3;
  Dar_Cut_t *pDVar4;
  
  p_00 = p->pManAig->vObjs;
  uVar3 = (ulong)p_00->nSize;
  pAreaFlows = (int *)calloc(1,uVar3 << 2);
  __ptr = (undefined8 *)malloc(0x10);
  *__ptr = 100;
  pvVar1 = malloc(800);
  __ptr[1] = pvVar1;
  for (i = 0; i < (int)uVar3; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p_00,i);
    if ((pvVar1 != (void *)0x0) &&
       (uVar3 = *(ulong *)((long)pvVar1 + 0x18), 0xfffffffd < ((uint)uVar3 & 7) - 7)) {
      pCut = *(Dar_Cut_t **)((long)pvVar1 + 0x28);
      pDVar4 = (Dar_Cut_t *)0x0;
      for (uVar2 = 0; uVar2 < (byte)(uVar3 >> 0x38); uVar2 = uVar2 + 1) {
        if ((((*(uint *)&pCut->field_0x4 >> 0x1c & 1) != 0) &&
            (*(uint *)&pCut->field_0x4 = *(uint *)&pCut->field_0x4 & 0xf7ffffff, uVar2 != 0)) &&
           (((Cnf_CutAssignAreaFlow(p,pCut,pAreaFlows), pDVar4 == (Dar_Cut_t *)0x0 ||
             (pCut->uSign < pDVar4->uSign)) ||
            ((pDVar4->uSign == pCut->uSign &&
             ((*(ushort *)&pDVar4->field_0x6 & 0x7ff) < (*(ushort *)&pCut->field_0x6 & 0x7ff)))))))
        {
          pDVar4 = pCut;
        }
        pCut = pCut + 1;
        uVar3 = *(ulong *)((long)pvVar1 + 0x18);
      }
      if ((int)pDVar4->uSign < 0x3b9aca01) {
        pAreaFlows[*(int *)((long)pvVar1 + 0x24)] = pDVar4->uSign;
        pDVar4->field_0x7 = pDVar4->field_0x7 | 8;
      }
      else {
        pAreaFlows[*(int *)((long)pvVar1 + 0x24)] = 1000000000;
        *(ulong *)((long)pvVar1 + 0x18) = uVar3 | 0x20;
      }
    }
    p_00 = p->pManAig->vObjs;
    uVar3 = (ulong)(uint)p_00->nSize;
  }
  free((void *)__ptr[1]);
  free(__ptr);
  free(pAreaFlows);
  return;
}

Assistant:

void Cnf_DeriveMapping( Cnf_Man_t * p )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pObj;
    Dar_Cut_t * pCut, * pCutBest;
    int i, k, AreaFlow, * pAreaFlows;
    // allocate area flows
    pAreaFlows = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
    memset( pAreaFlows, 0, sizeof(int) * Aig_ManObjNumMax(p->pManAig) );
    // visit the nodes in the topological order and update their best cuts
    vSuper = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( p->pManAig, pObj, i )
    {
        // go through the cuts
        pCutBest = NULL;
        Dar_ObjForEachCut( pObj, pCut, k )
        {
            pCut->fBest = 0;
            if ( k == 0 )
                continue;
            Cnf_CutAssignAreaFlow( p, pCut, pAreaFlows );
            if ( pCutBest == NULL || pCutBest->uSign > pCut->uSign || 
                (pCutBest->uSign == pCut->uSign && pCutBest->Value < pCut->Value) )
                 pCutBest = pCut;
        }
        // check the big cut
//        Aig_ObjCollectSuper( pObj, vSuper );
        // get the area flow of this cut
//        AreaFlow = Cnf_CutSuperAreaFlow( vSuper, pAreaFlows );
        AreaFlow = ABC_INFINITY;
        if ( AreaFlow >= (int)pCutBest->uSign )
        {
            pAreaFlows[pObj->Id] = pCutBest->uSign;
            pCutBest->fBest = 1;
        }
        else
        {
            pAreaFlows[pObj->Id] = AreaFlow;
            pObj->fMarkB = 1; // mark the special node
        }
    }
    Vec_PtrFree( vSuper );
    ABC_FREE( pAreaFlows );

/*
    // compute the area of mapping
    AreaFlow = 0;
    Aig_ManForEachCo( p->pManAig, pObj, i )
        AreaFlow += Dar_ObjBestCut(Aig_ObjFanin0(pObj))->uSign / 100 / Aig_ObjFanin0(pObj)->nRefs;
    printf( "Area of the network = %d.\n", AreaFlow );
*/
}